

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O2

Msat_Type_t
Msat_SolverSearch(Msat_Solver_t *p,int nConfLimit,int nLearnedLimit,int nBackTrackLimit,
                 Msat_SearchParams_t *pPars)

{
  ABC_INT64_T *pAVar1;
  uint Lit;
  Msat_IntVec_t *pMVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Msat_Clause_t *pC;
  Msat_Clause_t **ppMVar9;
  long lVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  Msat_Type_t MVar14;
  char *pcVar15;
  ulong uVar16;
  float fVar17;
  double dVar18;
  uint local_74;
  Msat_Clause_t *local_38;
  
  iVar4 = Msat_SolverReadDecisionLevel(p);
  if (iVar4 != p->nLevelRoot) {
    __assert_fail("Msat_SolverReadDecisionLevel(p) == p->nLevelRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                  ,0x21e,
                  "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                 );
  }
  (p->Stats).nStarts = (p->Stats).nStarts + 1;
  p->dVarDecay = 1.0 / pPars->dVarDecay;
  p->dClaDecay = 1.0 / pPars->dClaDecay;
  uVar12 = 0;
  uVar16 = (ulong)(uint)p->nVars;
  if (p->nVars < 1) {
    uVar16 = uVar12;
  }
  for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
    p->pdActivity[uVar12] = (double)p->pFactors[uVar12];
  }
  iVar4 = 0;
  do {
    while (pC = Msat_SolverPropagate(p), pC == (Msat_Clause_t *)0x0) {
      Msat_IntVecReadSize(p->vTrailLim);
      iVar5 = Msat_IntVecReadSize(p->vTrail);
      if ((-1 < nLearnedLimit) &&
         (iVar6 = Msat_ClauseVecReadSize(p->vLearned), iVar5 + nLearnedLimit <= iVar6)) {
        dVar18 = p->dClaInc;
        iVar5 = Msat_ClauseVecReadSize(p->vLearned);
        Msat_SolverSortDB(p);
        iVar6 = Msat_ClauseVecReadSize(p->vLearned);
        ppMVar9 = Msat_ClauseVecReadArray(p->vLearned);
        uVar12 = 0;
        uVar16 = (long)iVar6 / 2 & 0xffffffff;
        if ((int)((long)iVar6 / 2) < 1) {
          uVar16 = uVar12;
        }
        iVar13 = 0;
        for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
          iVar7 = Msat_ClauseIsLocked(p,ppMVar9[uVar12]);
          if (iVar7 == 0) {
            Msat_ClauseFree(p,ppMVar9[uVar12],1);
          }
          else {
            lVar10 = (long)iVar13;
            iVar13 = iVar13 + 1;
            ppMVar9[lVar10] = ppMVar9[uVar12];
          }
        }
        for (; (long)uVar16 < (long)iVar6; uVar16 = uVar16 + 1) {
          iVar7 = Msat_ClauseIsLocked(p,ppMVar9[uVar16]);
          if ((iVar7 != 0) ||
             (fVar17 = Msat_ClauseReadActivity(ppMVar9[uVar16]),
             dVar18 / (double)iVar5 <= (double)fVar17)) {
            lVar10 = (long)iVar13;
            iVar13 = iVar13 + 1;
            ppMVar9[lVar10] = ppMVar9[uVar16];
          }
          else {
            Msat_ClauseFree(p,ppMVar9[uVar16],1);
          }
        }
        Msat_ClauseVecShrink(p->vLearned,iVar13);
      }
      iVar5 = Msat_OrderVarSelect(p->pOrder);
      if (iVar5 == -3) {
        memcpy(p->pModel,p->pAssigns,(long)p->nVars << 2);
        MVar14 = MSAT_TRUE;
        goto LAB_0072f32f;
      }
      if (nConfLimit < iVar4 && 0 < nConfLimit) {
        dVar18 = Msat_SolverProgressEstimate(p);
        p->dProgress = dVar18;
LAB_0072f32d:
        MVar14 = MSAT_UNKNOWN;
LAB_0072f32f:
        Msat_QueueClear(p->pQueue);
        Msat_SolverCancelUntil(p,p->nLevelRoot);
        return MVar14;
      }
      if ((0 < nBackTrackLimit) && (nBackTrackLimit < (int)(p->Stats).nConflicts - p->nBackTracks))
      goto LAB_0072f32d;
      pAVar1 = &(p->Stats).nDecisions;
      *pAVar1 = *pAVar1 + 1;
      if ((iVar5 < 0) || (p->nVars <= iVar5)) {
        __assert_fail("Var != MSAT_ORDER_UNKNOWN && Var >= 0 && Var < p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                      ,0x26c,
                      "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                     );
      }
      iVar5 = Msat_SolverAssume(p,iVar5 * 2);
      if (iVar5 == 0) {
        __assert_fail("Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                      ,0x26e,
                      "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                     );
      }
    }
    if (p->fVerbose != 0) {
      iVar5 = Msat_SolverReadDecisionLevel(p);
      uVar8 = Msat_SolverReadDecisionLevel(p);
      printf("%-*d**CONFLICT**  ",(ulong)(iVar5 * 3 + 3),(ulong)uVar8);
      Msat_ClausePrintSymbols(pC);
    }
    pAVar1 = &(p->Stats).nConflicts;
    *pAVar1 = *pAVar1 + 1;
    iVar5 = Msat_SolverReadDecisionLevel(p);
    if (iVar5 == p->nLevelRoot) {
      return MSAT_FALSE;
    }
    iVar4 = iVar4 + 1;
    pMVar2 = p->vTemp;
    iVar6 = Msat_IntVecReadSize(p->vTrailLim);
    iVar13 = Msat_IntVecReadSize(p->vTrail);
    iVar13 = iVar13 + -1;
    p->nSeenId = p->nSeenId + 1;
    Msat_IntVecClear(pMVar2);
    Msat_IntVecPush(pMVar2,-1);
    local_74 = 0;
    uVar8 = 0xfffffffe;
    iVar5 = 0;
    do {
      if (pC == (Msat_Clause_t *)0x0) {
        __assert_fail("pC != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                      ,0x1d6,
                      "void Msat_SolverAnalyze(Msat_Solver_t *, Msat_Clause_t *, Msat_IntVec_t *, int *)"
                     );
      }
      Msat_ClauseCalcReason(p,pC,uVar8,p->vReason);
      uVar8 = Msat_IntVecReadSize(p->vReason);
      piVar11 = Msat_IntVecReadArray(p->vReason);
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      for (uVar16 = 0; iVar7 = iVar13, uVar8 != uVar16; uVar16 = uVar16 + 1) {
        Lit = piVar11[uVar16];
        iVar7 = (int)Lit >> 1;
        if (p->pSeen[iVar7] != p->nSeenId) {
          p->pSeen[iVar7] = p->nSeenId;
          Msat_SolverVarBumpActivity(p,Lit);
          if (p->pLevel[iVar7] == iVar6) {
            iVar5 = iVar5 + 1;
          }
          else if (0 < p->pLevel[iVar7]) {
            Msat_IntVecPush(pMVar2,Lit ^ 1);
            if ((int)local_74 <= p->pLevel[iVar7]) {
              local_74 = p->pLevel[iVar7];
            }
          }
        }
      }
      do {
        iVar13 = iVar7 + -1;
        uVar8 = Msat_IntVecReadEntry(p->vTrail,iVar7);
        iVar7 = iVar13;
      } while (p->pSeen[(int)uVar8 >> 1] != p->nSeenId);
      pC = p->pReasons[(int)uVar8 >> 1];
      bVar3 = 1 < iVar5;
      iVar5 = iVar5 + -1;
    } while (bVar3);
    Msat_IntVecWriteEntry(pMVar2,0,uVar8 ^ 1);
    if (p->fVerbose != 0) {
      iVar5 = Msat_SolverReadDecisionLevel(p);
      uVar8 = Msat_SolverReadDecisionLevel(p);
      printf("%-*dLearnt {",(ulong)(iVar5 * 3 + 3),(ulong)uVar8);
      uVar8 = Msat_IntVecReadSize(pMVar2);
      piVar11 = Msat_IntVecReadArray(pMVar2);
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      for (uVar16 = 0; uVar8 != uVar16; uVar16 = uVar16 + 1) {
        pcVar15 = "-";
        if ((piVar11[uVar16] & 1U) == 0) {
          pcVar15 = "";
        }
        printf(" %s%d",pcVar15,(ulong)((piVar11[uVar16] >> 1) + 1));
      }
      printf(" } at level %d\n",(ulong)local_74);
    }
    if ((int)local_74 < p->nLevelRoot) {
      local_74 = p->nLevelRoot;
    }
    Msat_SolverCancelUntil(p,local_74);
    pMVar2 = p->vTemp;
    iVar5 = Msat_IntVecReadSize(pMVar2);
    if (iVar5 == 0) {
      __assert_fail("Msat_IntVecReadSize(vLits) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                    ,0x96,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
    }
    iVar5 = Msat_ClauseCreate(p,pMVar2,1,&local_38);
    if (iVar5 == 0) {
      __assert_fail("Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                    ,0x98,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
    }
    iVar5 = Msat_IntVecReadEntry(pMVar2,0);
    iVar5 = Msat_SolverEnqueue(p,iVar5,local_38);
    if (iVar5 == 0) {
      __assert_fail("Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                    ,0x9a,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
    }
    if (local_38 != (Msat_Clause_t *)0x0) {
      Msat_ClauseVecPush(p->vLearned,local_38);
    }
    Msat_SolverVarDecayActivity(p);
    Msat_SolverClaDecayActivity(p);
  } while( true );
}

Assistant:

Msat_Type_t Msat_SolverSearch( Msat_Solver_t * p, int nConfLimit, int nLearnedLimit, int nBackTrackLimit, Msat_SearchParams_t * pPars )
{
    Msat_Clause_t * pConf;
    Msat_Var_t Var;
    int nLevelBack, nConfs, nAssigns, Value;
    int i;

    assert( Msat_SolverReadDecisionLevel(p) == p->nLevelRoot );
    p->Stats.nStarts++;
    p->dVarDecay = 1 / pPars->dVarDecay;
    p->dClaDecay = 1 / pPars->dClaDecay;

    // reset the activities
    for ( i = 0; i < p->nVars; i++ )
       p->pdActivity[i] = (double)p->pFactors[i];
//       p->pdActivity[i] = 0.0;

    nConfs = 0;
    while ( 1 )
    {
        pConf = Msat_SolverPropagate( p );
        if ( pConf != NULL ){
            // CONFLICT
            if ( p->fVerbose )
            {
//                printf(L_IND"**CONFLICT**\n", L_ind);
                printf(L_IND"**CONFLICT**  ", L_ind);
                Msat_ClausePrintSymbols( pConf );
            }
            // count conflicts
            p->Stats.nConflicts++;
            nConfs++;

            // if top level, return UNSAT
            if ( Msat_SolverReadDecisionLevel(p) == p->nLevelRoot )
                return MSAT_FALSE;

            // perform conflict analysis
            Msat_SolverAnalyze( p, pConf, p->vTemp, &nLevelBack );
            Msat_SolverCancelUntil( p, (p->nLevelRoot > nLevelBack)? p->nLevelRoot : nLevelBack );
            Msat_SolverRecord( p, p->vTemp );

            // it is important that recording is done after cancelling
            // because canceling cleans the queue while recording adds to it
            Msat_SolverVarDecayActivity( p );
            Msat_SolverClaDecayActivity( p );

        }
        else{
            // NO CONFLICT
            if ( Msat_IntVecReadSize(p->vTrailLim) == 0 ) {
                // Simplify the set of problem clauses:
//                Value = Msat_SolverSimplifyDB(p);
//                assert( Value );
            }
            nAssigns = Msat_IntVecReadSize( p->vTrail );
            if ( nLearnedLimit >= 0 && Msat_ClauseVecReadSize(p->vLearned) >= nLearnedLimit + nAssigns ) {
                // Reduce the set of learnt clauses:
                Msat_SolverReduceDB(p);
            }

            Var = Msat_OrderVarSelect( p->pOrder );
            if ( Var == MSAT_ORDER_UNKNOWN ) {
                // Model found and stored in p->pAssigns
                memcpy( p->pModel, p->pAssigns, sizeof(int) * p->nVars );
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_TRUE;
            }
            if ( nConfLimit > 0 && nConfs > nConfLimit ) {
                // Reached bound on number of conflicts:
                p->dProgress = Msat_SolverProgressEstimate( p );
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_UNKNOWN; 
            }
            else if ( nBackTrackLimit > 0 && (int)p->Stats.nConflicts - p->nBackTracks > nBackTrackLimit ) {
                // Reached bound on number of conflicts:
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_UNKNOWN; 
            }
            else{
                // New variable decision:
                p->Stats.nDecisions++;
                assert( Var != MSAT_ORDER_UNKNOWN && Var >= 0 && Var < p->nVars );
                Value = Msat_SolverAssume(p, MSAT_VAR2LIT(Var,0) );
                assert( Value );
            }
        }
    }
}